

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O3

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::sequence<toml::detail::in_range<(char)48,(char)57>>::
invoke<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,sequence<toml::detail::in_range<(char)48,(char)57>> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  value_type *other;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_c0;
  region<std::vector<char,_std::allocator<char>_>_> local_70;
  
  in_range<(char)48,(char)57>::invoke<std::vector<char,std::allocator<char>>>
            (&local_c0,(in_range<(char)48,(char)57> *)this,loc);
  if (local_c0.is_ok_ == false) {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap(&local_c0);
    region<std::vector<char,_std::allocator<char>_>_>::operator+=
              ((region<std::vector<char,_std::allocator<char>_>_> *)loc,other);
    region<std::vector<char,_std::allocator<char>_>_>::region
              (&local_70,(region<std::vector<char,_std::allocator<char>_>_> *)loc);
    _Var3._M_pi = local_70.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_0015dac0;
    paVar2 = &local_70.source_name_.field_2;
    local_70.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_70.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    local_70.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.source_name_._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_70.source_name_.field_2._M_allocated_capacity._1_7_,
                    local_70.source_name_.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8)
           = local_70.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
           local_70.source_name_._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
           CONCAT71(local_70.source_name_.field_2._M_allocated_capacity._1_7_,
                    local_70.source_name_.field_2._M_local_buf[0]);
    }
    (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length =
         local_70.source_name_._M_string_length;
    local_70.source_name_._M_string_length = 0;
    local_70.source_name_.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_70.first_._M_current;
    (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_70.last_._M_current;
    local_70.source_name_._M_dataplus._M_p = (pointer)paVar2;
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_70);
  }
  if (local_c0.is_ok_ == true) {
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_c0.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return ok(reg);
    }